

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O1

bool __thiscall dxil_spv::MemoryStream::map_string_iterate(MemoryStream *this,char **str)

{
  ulong uVar1;
  uint8_t uVar2;
  ulong uVar3;
  
  uVar3 = this->blob_offset;
  *str = (char *)(this->blob + uVar3);
  do {
    uVar1 = uVar3 + 1;
    if (this->blob_size < uVar1) break;
    uVar2 = this->blob[uVar3];
    this->blob_offset = uVar1;
    uVar3 = uVar1;
  } while (uVar2 != '\0');
  return uVar1 <= this->blob_size;
}

Assistant:

bool MemoryStream::map_string_iterate(const char *&str)
{
	// Strings are C strings and can be mapped 1:1.
	// Just need to verify they terminate properly.
	str = reinterpret_cast<const char *>(blob + blob_offset);
	char c;

	do
	{
		if (!read(c))
			return false;
		else if (c == '\0')
			break;
	} while (c != '\0');

	return true;
}